

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O2

Literals * __thiscall
wasm::ShellExternalInterface::callImport
          (Literals *__return_storage_ptr__,ShellExternalInterface *this,Function *import,
          Literals *arguments)

{
  Literal *this_00;
  SmallVector<wasm::Literal,_1UL> *pSVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ModuleRunnerBase<wasm::ModuleRunner> *this_01;
  Fatal *this_02;
  undefined8 uVar5;
  Literal *pLVar6;
  size_t sVar7;
  long lVar8;
  string_view prefix;
  ConstIterator CVar9;
  undefined1 auStack_1f8 [8];
  undefined1 local_1f0 [8];
  value_type argument;
  Literal local_68;
  size_t local_50;
  Literal *local_48;
  Literals *local_40;
  SmallVector<wasm::Literal,_1UL> *local_38;
  
  pcVar4 = (import->super_Importable).module.super_IString.str._M_str;
  local_38 = &arguments->super_SmallVector<wasm::Literal,_1UL>;
  if (pcVar4 == _divF32x4) {
    prefix._M_str = _extendLowUToI32x4;
    prefix._M_len = PRINT;
    bVar2 = IString::startsWith(&(import->super_Importable).base.super_IString,prefix);
    pSVar1 = local_38;
    if (bVar2) {
      local_40 = __return_storage_ptr__;
      CVar9 = SmallVector<wasm::Literal,_1UL>::end(local_38);
      local_50 = CVar9.
                 super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
                 .index;
      local_48 = (pSVar1->fixed)._M_elems;
      lVar8 = -0x18;
      this_00 = (Literal *)(auStack_1f8 + 8);
      for (sVar7 = 0;
          local_50 != sVar7 ||
          CVar9.
          super_IteratorBase<const_wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::ConstIterator>
          .parent != pSVar1; sVar7 = sVar7 + 1) {
        pLVar6 = (Literal *)
                 ((long)&((local_38->flexible).
                          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                          super__Vector_impl_data._M_start)->field_0 + lVar8);
        if (sVar7 == 0) {
          pLVar6 = local_48;
        }
        wasm::Literal::Literal(this_00,pLVar6);
        wasm::Literal::Literal(&local_68,this_00);
        poVar3 = (ostream *)wasm::operator<<((ostream *)&std::cout,_auStack_1f8);
        poVar3 = std::operator<<(poVar3," : ");
        poVar3 = (ostream *)
                 wasm::operator<<(poVar3,(Type)argument.field_0.gcData.
                                               super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi);
        std::operator<<(poVar3,'\n');
        wasm::Literal::~Literal(&local_68);
        wasm::Literal::~Literal(this_00);
        lVar8 = lVar8 + 0x18;
      }
      (local_40->super_SmallVector<wasm::Literal,_1UL>).flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_40->super_SmallVector<wasm::Literal,_1UL>).flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_40->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.func.super_IString
      .str._M_str = (char *)0x0;
      (local_40->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].type.id = 0;
      (local_40->super_SmallVector<wasm::Literal,_1UL>).usedFixed = 0;
      (local_40->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems[0].field_0.i64 = 0;
      (local_40->super_SmallVector<wasm::Literal,_1UL>).flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return local_40;
    }
    pcVar4 = (import->super_Importable).module.super_IString.str._M_str;
  }
  if ((pcVar4 == _addTable) &&
     ((import->super_Importable).base.super_IString.str._M_str == __Literal)) {
    std::operator<<((ostream *)&std::cout,"exit()\n");
    uVar5 = __cxa_allocate_exception(1);
    __cxa_throw(uVar5,&ExitException::typeinfo,0);
  }
  this_01 = &getImportInstance(this,&import->super_Importable)->
             super_ModuleRunnerBase<wasm::ModuleRunner>;
  if (this_01 != (ModuleRunnerBase<wasm::ModuleRunner> *)0x0) {
    ModuleRunnerBase<wasm::ModuleRunner>::callExport
              (__return_storage_ptr__,this_01,
               (Name)(import->super_Importable).base.super_IString.str,(Literals *)local_38);
    return __return_storage_ptr__;
  }
  Fatal::Fatal((Fatal *)(auStack_1f8 + 8));
  std::operator<<((ostream *)&argument.field_0.func.super_IString.str._M_str,
                  "callImport: unknown import: ");
  this_02 = Fatal::operator<<((Fatal *)(auStack_1f8 + 8),
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              &(import->super_Importable).module);
  std::operator<<((ostream *)&this_02->field_0x10,".");
  Fatal::operator<<(this_02,(basic_string_view<char,_std::char_traits<char>_> *)import);
  Fatal::~Fatal((Fatal *)(auStack_1f8 + 8));
}

Assistant:

Literals callImport(Function* import, const Literals& arguments) override {
    if (import->module == SPECTEST && import->base.startsWith(PRINT)) {
      for (auto argument : arguments) {
        std::cout << argument << " : " << argument.type << '\n';
      }
      return {};
    } else if (import->module == ENV && import->base == EXIT) {
      // XXX hack for torture tests
      std::cout << "exit()\n";
      throw ExitException();
    } else if (auto* inst = getImportInstance(import)) {
      return inst->callExport(import->base, arguments);
    }
    Fatal() << "callImport: unknown import: " << import->module.str << "."
            << import->name.str;
  }